

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O3

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  byte bVar1;
  byte bVar2;
  lua_State *plVar3;
  StkId pTVar4;
  lu_mem *osize;
  ulong uVar5;
  lua_State *L1;
  bool bVar6;
  
  if ((lua_State *)*p != (lua_State *)0x0) {
    bVar1 = L->l_G->currentwhite;
    L1 = (lua_State *)*p;
    do {
      bVar6 = count == 0;
      count = count - 1;
      if (bVar6) {
        return &((lua_State *)p)->next;
      }
      if ((byte)((L1->marked ^ 3) & (bVar1 ^ 3)) != 0) {
        L1->marked = L1->marked & 0xf8 | bVar1 & 3;
        p = &L1->next;
        goto LAB_0011b873;
      }
      plVar3 = (lua_State *)L1->next;
      ((lua_State *)p)->next = (GCObject *)plVar3;
      switch(L1->tt) {
      case '\x04':
        luaS_remove(L,(TString *)L1);
        pTVar4 = (StkId)(ulong)*(byte *)((long)&L1->nci + 1);
        goto LAB_0011b7e8;
      case '\x05':
        luaH_free(L,(Table *)L1);
        break;
      case '\x06':
        bVar2 = (byte)L1->nci;
        if (bVar2 == 0) {
          osize = (lu_mem *)0x20;
        }
        else {
          uVar5 = 0;
          do {
            if ((&L1->ci)[uVar5] != (CallInfo *)0x0) {
              luaC_upvdeccount(L,(UpVal *)(&L1->ci)[uVar5]);
              bVar2 = (byte)L1->nci;
            }
            uVar5 = uVar5 + 1;
          } while (uVar5 < bVar2);
          osize = (lu_mem *)((ulong)bVar2 * 8 + 0x20);
        }
        goto LAB_0011b866;
      case '\a':
        osize = &L1->l_G->GCestimate;
        goto LAB_0011b866;
      case '\b':
        luaE_freethread(L,L1);
        break;
      case '\t':
        luaF_freeproto(L,(Proto *)L1);
        break;
      case '\n':
      case '\v':
      case '\f':
      case '\r':
      case '\x0e':
      case '\x0f':
      case '\x10':
      case '\x11':
      case '\x12':
      case '\x13':
        goto switchD_0011b7b3_caseD_a;
      case '\x14':
        pTVar4 = L1->top;
LAB_0011b7e8:
        osize = (lu_mem *)((long)&pTVar4[1].tt_ + 1);
LAB_0011b866:
        luaM_realloc_(L,L1,(size_t)osize,0);
        break;
      default:
        if (L1->tt == '&') {
          osize = (lu_mem *)((ulong)(byte)L1->nci * 0x10 + 0x20);
          goto LAB_0011b866;
        }
        goto switchD_0011b7b3_caseD_a;
      }
LAB_0011b873:
      plVar3 = (lua_State *)((lua_State *)p)->next;
switchD_0011b7b3_caseD_a:
      L1 = plVar3;
    } while (plVar3 != (lua_State *)0x0);
  }
  return (GCObject **)0x0;
}

Assistant:

static GCObject **sweeplist (lua_State *L, GCObject **p, int countin,
                             int *countout) {
  global_State *g = G(L);
  int ow = otherwhite(g);
  int i;
  int white = luaC_white(g);  /* current white */
  for (i = 0; *p != NULL && i < countin; i++) {
    GCObject *curr = *p;
    int marked = curr->marked;
    if (isdeadm(ow, marked)) {  /* is 'curr' dead? */
      *p = curr->next;  /* remove 'curr' from list */
      freeobj(L, curr);  /* erase 'curr' */
    }
    else {  /* change mark to 'white' */
      curr->marked = cast_byte((marked & maskcolors) | white);
      p = &curr->next;  /* go to next element */
    }
  }
  if (countout)
    *countout = i;  /* number of elements traversed */
  return (*p == NULL) ? NULL : p;
}